

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.h
# Opt level: O0

void __thiscall
PropertiesDBusInterface::PropertiesDBusInterface
          (PropertiesDBusInterface *this,QString *service,QString *path,QString *interface,
          QDBusConnection *connection,QObject *parent)

{
  long lVar1;
  char *pcVar2;
  QString *in_RDX;
  QByteArray *in_RSI;
  QDBusAbstractInterface *in_RDI;
  QDBusConnection *in_R8;
  QObject *in_R9;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLatin1(in_stack_ffffffffffffff88);
  pcVar2 = QByteArray::data(in_RSI);
  QDBusAbstractInterface::QDBusAbstractInterface(in_RDI,(QString *)in_RSI,in_RDX,pcVar2,in_R8,in_R9)
  ;
  QByteArray::~QByteArray((QByteArray *)0x10a2db);
  *(undefined ***)in_RDI = &PTR_metaObject_00128778;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PropertiesDBusInterface(const QString &service, const QString &path, const QString &interface,
                            const QDBusConnection &connection, QObject *parent = nullptr)
        : QDBusAbstractInterface(service, path, interface.toLatin1().data(), connection, parent)
    {
    }